

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermOrderingDiagram.cpp
# Opt level: O0

void __thiscall Kernel::TermOrderingDiagram::processVarNode(TermOrderingDiagram *this)

{
  bool bVar1;
  Node *pNVar2;
  Trace *pTVar3;
  long in_RDI;
  Result val;
  Trace *trace;
  Node *node;
  Branch *in_stack_ffffffffffffff28;
  Branch *in_stack_ffffffffffffff30;
  TermList in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff60;
  TermOrderingDiagram *in_stack_ffffffffffffff88;
  Result *in_stack_ffffffffffffff90;
  TermPartialOrdering *in_stack_ffffffffffffff98;
  TermList in_stack_ffffffffffffffa0;
  TermList in_stack_ffffffffffffffa8;
  int local_1c;
  
  pNVar2 = Branch::node(*(Branch **)(in_RDI + 0x20));
  pTVar3 = getCurrentTrace(in_stack_ffffffffffffff88);
  bVar1 = TermPartialOrdering::get
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff90);
  if (bVar1) {
    if (local_1c == 1) {
      Branch::Branch(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::~Branch((Branch *)0x99754f);
    }
    else if (local_1c == 3) {
      Branch::Branch(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::~Branch((Branch *)0x9975c4);
    }
    else {
      Branch::Branch(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::~Branch((Branch *)0x99762f);
    }
  }
  else {
    if (1 < pNVar2->refcnt) {
      Branch::Branch((Branch *)&stack0xffffffffffffffa0,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
      Branch::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::~Branch((Branch *)0x9976ca);
      Branch::Branch(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::node(*(Branch **)(in_RDI + 0x20));
      Branch::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::~Branch((Branch *)0x997714);
      Branch::Branch(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::node(*(Branch **)(in_RDI + 0x20));
      Branch::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::~Branch((Branch *)0x99775e);
      Branch::Branch(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::node(*(Branch **)(in_RDI + 0x20));
      Branch::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Branch::~Branch((Branch *)0x9977a8);
    }
    pNVar2 = Branch::node(*(Branch **)(in_RDI + 0x20));
    pNVar2->ready = true;
    pNVar2 = Branch::node(*(Branch **)(in_RDI + 0x20));
    pNVar2->trace = pTVar3;
  }
  return;
}

Assistant:

void TermOrderingDiagram::processVarNode()
{
  auto node = _curr->node();
  auto trace = getCurrentTrace();
  Ordering::Result val;
  if (trace->get(node->lhs, node->rhs, val)) {
    if (val == Ordering::GREATER) {
      *_curr = node->gtBranch;
    } else if (val == Ordering::EQUAL) {
      *_curr = node->eqBranch;
    } else {
      *_curr = node->ngeBranch;
    }
    return;
  }
  // if refcnt > 1 we have to copy the node,
  // otherwise we can mutate the original
  if (node->refcnt > 1) {
    *_curr = Branch(node->lhs, node->rhs);
    _curr->node()->eqBranch = node->eqBranch;
    _curr->node()->gtBranch = node->gtBranch;
    _curr->node()->ngeBranch = node->ngeBranch;
  }
  _curr->node()->ready = true;
  _curr->node()->trace = trace;
}